

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::EntropyFunction<duckdb::ModeStandard<short>>::
     Finalize<double,duckdb::ModeState<short,duckdb::ModeStandard<short>>>
               (ModeState<short,_duckdb::ModeStandard<short>_> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  __node_base *p_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (state->frequency_map == (Counts *)0x0) {
    dVar2 = 0.0;
  }
  else {
    dVar4 = ((double)CONCAT44(0x45300000,(int)(state->count >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)state->count) - 4503599627370496.0);
    p_Var1 = &(state->frequency_map->_M_h)._M_before_begin;
    dVar2 = 0.0;
    while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
      dVar5 = ((double)CONCAT44(0x45300000,
                                (int)((ulong)*(_Hash_node_base **)
                                              &((_Prime_rehash_policy *)(p_Var1 + 2))->
                                               _M_max_load_factor >> 0x20)) - 1.9342813113834067e+25
              ) + ((double)CONCAT44(0x43300000,
                                    (int)*(_Hash_node_base **)
                                          &((_Prime_rehash_policy *)(p_Var1 + 2))->
                                           _M_max_load_factor) - 4503599627370496.0);
      dVar3 = log2(dVar4 / dVar5);
      dVar2 = dVar2 + dVar3 * (dVar5 / dVar4);
    }
  }
  *target = dVar2;
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		target = FinalizeEntropy(state);
	}